

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void Imf_2_5::DwaCompressor::initializeFuncs(void)

{
  ulong in_RAX;
  CpuId cpuId;
  CpuId *in_stack_00000010;
  
  (anonymous_namespace)::convertFloatToHalf64 = anon_unknown_9::convertFloatToHalf64_scalar;
  (anonymous_namespace)::fromHalfZigZag = anon_unknown_9::fromHalfZigZag_scalar;
  CpuId::CpuId(in_stack_00000010);
  if (((in_RAX & 0x1000000000000) != 0) && ((in_RAX & 0x100000000000000) != 0)) {
    (anonymous_namespace)::convertFloatToHalf64 = anon_unknown_9::convertFloatToHalf64_f16c;
    (anonymous_namespace)::fromHalfZigZag = anon_unknown_9::fromHalfZigZag_f16c;
  }
  (anonymous_namespace)::dctInverse8x8_0 = anon_unknown_9::dctInverse8x8_scalar<0>;
  (anonymous_namespace)::dctInverse8x8_1 = anon_unknown_9::dctInverse8x8_scalar<1>;
  (anonymous_namespace)::dctInverse8x8_2 = anon_unknown_9::dctInverse8x8_scalar<2>;
  (anonymous_namespace)::dctInverse8x8_3 = anon_unknown_9::dctInverse8x8_scalar<3>;
  (anonymous_namespace)::dctInverse8x8_4 = anon_unknown_9::dctInverse8x8_scalar<4>;
  (anonymous_namespace)::dctInverse8x8_5 = anon_unknown_9::dctInverse8x8_scalar<5>;
  (anonymous_namespace)::dctInverse8x8_6 = anon_unknown_9::dctInverse8x8_scalar<6>;
  (anonymous_namespace)::dctInverse8x8_7 = anon_unknown_9::dctInverse8x8_scalar<7>;
  if ((in_RAX & 0x1000000000000) == 0) {
    if ((in_RAX & 0x100) != 0) {
      (anonymous_namespace)::dctInverse8x8_0 = anon_unknown_9::dctInverse8x8_sse2<0>;
      (anonymous_namespace)::dctInverse8x8_1 = anon_unknown_9::dctInverse8x8_sse2<1>;
      (anonymous_namespace)::dctInverse8x8_2 = anon_unknown_9::dctInverse8x8_sse2<2>;
      (anonymous_namespace)::dctInverse8x8_3 = anon_unknown_9::dctInverse8x8_sse2<3>;
      (anonymous_namespace)::dctInverse8x8_4 = anon_unknown_9::dctInverse8x8_sse2<4>;
      (anonymous_namespace)::dctInverse8x8_5 = anon_unknown_9::dctInverse8x8_sse2<5>;
      (anonymous_namespace)::dctInverse8x8_6 = anon_unknown_9::dctInverse8x8_sse2<6>;
      (anonymous_namespace)::dctInverse8x8_7 = anon_unknown_9::dctInverse8x8_sse2<7>;
    }
  }
  else {
    (anonymous_namespace)::dctInverse8x8_0 = anon_unknown_9::dctInverse8x8_avx<0>;
    (anonymous_namespace)::dctInverse8x8_1 = anon_unknown_9::dctInverse8x8_avx<1>;
    (anonymous_namespace)::dctInverse8x8_2 = anon_unknown_9::dctInverse8x8_avx<2>;
    (anonymous_namespace)::dctInverse8x8_3 = anon_unknown_9::dctInverse8x8_avx<3>;
    (anonymous_namespace)::dctInverse8x8_4 = anon_unknown_9::dctInverse8x8_avx<4>;
    (anonymous_namespace)::dctInverse8x8_5 = anon_unknown_9::dctInverse8x8_avx<5>;
    (anonymous_namespace)::dctInverse8x8_6 = anon_unknown_9::dctInverse8x8_avx<6>;
    (anonymous_namespace)::dctInverse8x8_7 = anon_unknown_9::dctInverse8x8_avx<7>;
  }
  return;
}

Assistant:

void
DwaCompressor::initializeFuncs()
{
    convertFloatToHalf64 = convertFloatToHalf64_scalar;
    fromHalfZigZag       = fromHalfZigZag_scalar;

    CpuId cpuId;

    //
    // Setup HALF <-> FLOAT conversion implementations
    //

    if (cpuId.avx && cpuId.f16c)
    {
        convertFloatToHalf64 = convertFloatToHalf64_f16c;
        fromHalfZigZag       = fromHalfZigZag_f16c;
    } 

    //
    // Setup inverse DCT implementations
    //

    dctInverse8x8_0 = dctInverse8x8_scalar<0>;
    dctInverse8x8_1 = dctInverse8x8_scalar<1>;
    dctInverse8x8_2 = dctInverse8x8_scalar<2>;
    dctInverse8x8_3 = dctInverse8x8_scalar<3>;
    dctInverse8x8_4 = dctInverse8x8_scalar<4>;
    dctInverse8x8_5 = dctInverse8x8_scalar<5>;
    dctInverse8x8_6 = dctInverse8x8_scalar<6>;
    dctInverse8x8_7 = dctInverse8x8_scalar<7>;

    if (cpuId.avx) 
    {
        dctInverse8x8_0 = dctInverse8x8_avx<0>;
        dctInverse8x8_1 = dctInverse8x8_avx<1>;
        dctInverse8x8_2 = dctInverse8x8_avx<2>;
        dctInverse8x8_3 = dctInverse8x8_avx<3>;
        dctInverse8x8_4 = dctInverse8x8_avx<4>;
        dctInverse8x8_5 = dctInverse8x8_avx<5>;
        dctInverse8x8_6 = dctInverse8x8_avx<6>;
        dctInverse8x8_7 = dctInverse8x8_avx<7>;
    } 
    else if (cpuId.sse2) 
    {
        dctInverse8x8_0 = dctInverse8x8_sse2<0>;
        dctInverse8x8_1 = dctInverse8x8_sse2<1>;
        dctInverse8x8_2 = dctInverse8x8_sse2<2>;
        dctInverse8x8_3 = dctInverse8x8_sse2<3>;
        dctInverse8x8_4 = dctInverse8x8_sse2<4>;
        dctInverse8x8_5 = dctInverse8x8_sse2<5>;
        dctInverse8x8_6 = dctInverse8x8_sse2<6>;
        dctInverse8x8_7 = dctInverse8x8_sse2<7>;
    }
}